

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyOpsBufferStorageTestCase::deinitTestCaseGlobal(CopyOpsBufferStorageTestCase *this)

{
  uint n_ref_data_buffer;
  long lVar1;
  
  if (this->m_helper_bo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_helper_bo);
    this->m_helper_bo = 0;
  }
  if (this->m_immutable_bo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_immutable_bo);
    this->m_immutable_bo = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (this->m_ref_data[lVar1] != (unsigned_short *)0x0) {
      operator_delete__(this->m_ref_data[lVar1]);
      this->m_ref_data[lVar1] = (unsigned_short *)0x0;
    }
  }
  if (this->m_sparse_bos[1] != 0) {
    (*this->m_gl->deleteBuffers)(1,this->m_sparse_bos + 1);
    this->m_sparse_bos[1] = 0;
  }
  return;
}

Assistant:

void CopyOpsBufferStorageTestCase::deinitTestCaseGlobal()
{
	if (m_helper_bo != 0)
	{
		m_gl.deleteBuffers(1, &m_helper_bo);

		m_helper_bo = 0;
	}

	if (m_immutable_bo != 0)
	{
		m_gl.deleteBuffers(1, &m_immutable_bo);

		m_immutable_bo = 0;
	}

	for (unsigned int n_ref_data_buffer = 0; n_ref_data_buffer < sizeof(m_ref_data) / sizeof(m_ref_data[0]);
		 ++n_ref_data_buffer)
	{
		if (m_ref_data[n_ref_data_buffer] != DE_NULL)
		{
			delete[] m_ref_data[n_ref_data_buffer];

			m_ref_data[n_ref_data_buffer] = DE_NULL;
		}
	}

	/* Only release the test case-owned BO */
	if (m_sparse_bos[1] != 0)
	{
		m_gl.deleteBuffers(1, m_sparse_bos + 1);

		m_sparse_bos[1] = 0;
	}
}